

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O2

LogStream * __thiscall sznet::LogStream::operator<<(LogStream *this,double v)

{
  char **ppcVar1;
  char *__s;
  int iVar2;
  
  ppcVar1 = &(this->m_buffer).m_cur;
  __s = (this->m_buffer).m_cur;
  if (0x20 < (int)ppcVar1 - (int)__s) {
    iVar2 = snprintf(__s,0x20,"%.12g");
    *ppcVar1 = *ppcVar1 + iVar2;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(double v)
{
	if (m_buffer.avail() > kMaxNumericSize)
	{
		int len = snprintf(m_buffer.current(), kMaxNumericSize, "%.12g", v);
		m_buffer.add(len);
	}
	return *this;
}